

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetOutputNameArtifactResultGetter<ArtifactLinkerTag>::Get_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetOutputNameArtifactResultGetter<ArtifactLinkerTag> *this,cmGeneratorTarget *target,
          cmGeneratorExpressionContext *context,GeneratorExpressionContent *content)

{
  bool bVar1;
  _Base_ptr *config;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  bVar1 = cmGeneratorTarget::IsLinkable((cmGeneratorTarget *)this);
  if (bVar1) {
    config = &(target->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    bVar1 = cmGeneratorTarget::HasImportLibrary((cmGeneratorTarget *)this,(string *)config);
    cmGeneratorTarget::GetOutputName
              (&local_40,(cmGeneratorTarget *)this,(string *)config,(uint)bVar1);
    cmGeneratorTarget::GetFilePostfix(&local_60,(cmGeneratorTarget *)this,(string *)config);
    std::operator+(__return_storage_ptr__,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_40,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,
               "TARGET_LINKER_FILE_BASE_NAME is allowed only for libraries and executables with ENABLE_EXPORTS."
               ,&local_61);
    reportError((cmGeneratorExpressionContext *)target,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string Get(cmGeneratorTarget* target,
                         cmGeneratorExpressionContext* context,
                         const GeneratorExpressionContent* content)
  {
    // The file used to link to the target (.so, .lib, .a).
    if (!target->IsLinkable()) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_LINKER_FILE_BASE_NAME is allowed only for "
                    "libraries and executables with ENABLE_EXPORTS.");
      return std::string();
    }
    cmStateEnums::ArtifactType artifact =
      target->HasImportLibrary(context->Config)
      ? cmStateEnums::ImportLibraryArtifact
      : cmStateEnums::RuntimeBinaryArtifact;
    return target->GetOutputName(context->Config, artifact) +
      target->GetFilePostfix(context->Config);
  }